

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Witness_complex.h
# Opt level: O2

bool __thiscall
Gudhi::witness_complex::
Witness_complex<std::vector<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>,std::allocator<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
::create_complex<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
          (Witness_complex<std::vector<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>,std::allocator<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_default> *complex,double max_alpha_square,
          size_t limit_dimension)

{
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *pvVar1;
  const_iterator cVar2;
  iterator curr_l;
  iterator end;
  bool bVar3;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_> *w;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *__args;
  ulong uVar4;
  char *pcVar5;
  const_iterator __position;
  Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  *this_00;
  Nearest_landmark_table_internal *__range3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> simplex;
  undefined7 uStack_67;
  ActiveWitnessList active_witnesses;
  iterator local_48;
  
  if ((complex->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0) {
    if (0.0 <= max_alpha_square) {
      active_witnesses.
      super__List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
      ._M_impl._M_node._M_size = 0;
      pvVar1 = *(vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 **)(this + 8);
      active_witnesses.
      super__List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&active_witnesses;
      active_witnesses.
      super__List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&active_witnesses;
      for (__args = *(vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      **)this; __args != pvVar1; __args = __args + 1) {
        std::__cxx11::
        list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
        ::
        emplace_back<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>const&>
                  ((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
                    *)&active_witnesses,__args);
      }
      uVar4 = 0;
      while ((cVar2._M_node =
                   active_witnesses.
                   super__List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next, uVar4 <= limit_dimension &&
             (active_witnesses.
              super__List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&active_witnesses
             ))) {
        simplex.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        simplex.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        simplex.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&simplex,uVar4 + 1);
        while (__position._M_node = cVar2._M_node,
              __position._M_node != (_List_node_base *)&active_witnesses) {
          this_00 = (Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                     *)(__position._M_node + 1);
          Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
          ::begin(&local_48,this_00);
          end._17_7_ = uStack_67;
          end.is_end_ = true;
          curr_l.lh_._M_node = local_48.lh_._M_node;
          curr_l.aw_ = local_48.aw_;
          curr_l.is_end_ = local_48.is_end_;
          curr_l._17_7_ = local_48._17_7_;
          end.lh_._M_node = (_List_node_base *)this_00;
          end.aw_ = this_00;
          bVar3 = add_all_faces_of_dimension<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
                            (this,(int)uVar4,max_alpha_square,INFINITY,curr_l,&simplex,complex,end);
          if (simplex.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              simplex.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            __assert_fail("simplex.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Witness_complex/include/gudhi/Witness_complex.h"
                          ,0x74,
                          "bool Gudhi::witness_complex::Witness_complex<std::vector<std::vector<std::pair<unsigned long, double>>>>::create_complex(SimplicialComplexForWitness &, double, std::size_t) const [Nearest_landmark_table_ = std::vector<std::vector<std::pair<unsigned long, double>>>, SimplicialComplexForWitness = Gudhi::Simplex_tree<>]"
                         );
          }
          cVar2._M_node = (__position._M_node)->_M_next;
          if (!bVar3) {
            std::__cxx11::
            list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
            ::erase((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                     *)&active_witnesses,__position);
          }
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&simplex.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        uVar4 = uVar4 + 1;
      }
      std::__cxx11::
      _List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
      ::_M_clear(&active_witnesses.
                  super__List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                );
      return true;
    }
    pcVar5 = 
    "Witness complex cannot create complex - squared relaxation parameter must be non-negative.\n";
  }
  else {
    pcVar5 = "Witness complex cannot create complex - complex is not empty.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar5);
  return false;
}

Assistant:

bool create_complex(SimplicialComplexForWitness& complex,
                      double  max_alpha_square,
                      std::size_t limit_dimension = std::numeric_limits<std::size_t>::max()) const {
    if (complex.num_vertices() > 0) {
      std::cerr << "Witness complex cannot create complex - complex is not empty.\n";
      return false;
    }
    if (max_alpha_square < 0) {
      std::cerr << "Witness complex cannot create complex - squared relaxation parameter must be non-negative.\n";
      return false;
    }
    ActiveWitnessList active_witnesses;
    Landmark_id k = 0; /* current dimension in iterative construction */
    for (auto&& w : nearest_landmark_table_)
      active_witnesses.emplace_back(w);
    while (!active_witnesses.empty() && k <= limit_dimension) {
      typename ActiveWitnessList::iterator aw_it = active_witnesses.begin();
      std::vector<Landmark_id> simplex;
      simplex.reserve(k+1);
      while (aw_it != active_witnesses.end()) {
        bool ok = add_all_faces_of_dimension(k,
                                             max_alpha_square,
                                             std::numeric_limits<double>::infinity(),
                                             aw_it->begin(),
                                             simplex,
                                             complex,
                                             aw_it->end());
        assert(simplex.empty());
        if (!ok)
          active_witnesses.erase(aw_it++);  // First increase the iterator and then erase the previous element
        else
          aw_it++;
      }
      k++;
    }
    return true;
  }